

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

int parsePosixTime(char *begin,char *end)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  char *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QSimpleParsedNumber<long_long> QVar4;
  int maxHour;
  int sec;
  int min;
  int hour;
  QSimpleParsedNumber<long_long> r;
  int local_5c;
  int local_58;
  char *local_48;
  int local_3c;
  long local_30;
  undefined1 in_stack_ffffffffffffffd8 [16];
  long size;
  long local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0;
  local_5c = 0;
  QVar4 = qstrntoll(&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffd8._8_8_,
                    in_stack_ffffffffffffffd8._4_4_);
  iVar3 = (int)QVar4.result;
  bVar2 = QSimpleParsedNumber<long_long>::ok
                    ((QSimpleParsedNumber<long_long> *)&stack0xffffffffffffffe8);
  if ((((bVar2) && (-0x8a < iVar3)) && (iVar3 < 0x8a)) && (local_10 = QVar4.used, local_10 < 3)) {
    local_48 = (char *)(local_10 + in_RDI);
    if ((local_48 < in_RSI) && (*local_48 == ':')) {
      QVar4 = qstrntoll((char *)QVar4.result,in_stack_ffffffffffffffd8._8_8_,
                        in_stack_ffffffffffffffd8._4_4_);
      size = QVar4.used;
      local_58 = (int)QVar4.result;
      bVar2 = QSimpleParsedNumber<long_long>::ok
                        ((QSimpleParsedNumber<long_long> *)&stack0xffffffffffffffe8);
      if (((!bVar2) || ((local_58 < 0 || (0x3b < local_58)))) || (2 < size)) {
        local_3c = -0x80000000;
        goto LAB_007515cc;
      }
      local_48 = local_48 + size + 1;
      if ((local_48 < in_RSI) && (*local_48 == ':')) {
        QVar4 = qstrntoll((char *)QVar4.result,size,QVar4.result._4_4_);
        local_30 = QVar4.used;
        local_5c = (int)QVar4.result;
        bVar2 = QSimpleParsedNumber<long_long>::ok
                          ((QSimpleParsedNumber<long_long> *)&stack0xffffffffffffffe8);
        if ((!bVar2) || (((local_5c < 0 || (0x3b < local_5c)) || (2 < local_30)))) {
          local_3c = -0x80000000;
          goto LAB_007515cc;
        }
        local_48 = local_48 + local_30 + 1;
      }
    }
    if (local_48 == in_RSI) {
      local_3c = (iVar3 * 0x3c + local_58) * 0x3c + local_5c;
    }
    else {
      local_3c = -0x80000000;
    }
  }
  else {
    local_3c = -0x80000000;
  }
LAB_007515cc:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

static int parsePosixTime(const char *begin, const char *end)
{
    // Format "hh[:mm[:ss]]"
    int hour, min = 0, sec = 0;

    const int maxHour = 137; // POSIX's extended range.
    auto r = qstrntoll(begin, end - begin, 10);
    hour = r.result;
    if (!r.ok() || hour < -maxHour || hour > maxHour || r.used > 2)
        return INT_MIN;
    begin += r.used;
    if (begin < end && *begin == ':') {
        // minutes
        ++begin;
        r = qstrntoll(begin, end - begin, 10);
        min = r.result;
        if (!r.ok() || min < 0 || min > 59 || r.used > 2)
            return INT_MIN;

        begin += r.used;
        if (begin < end && *begin == ':') {
            // seconds
            ++begin;
            r = qstrntoll(begin, end - begin, 10);
            sec = r.result;
            if (!r.ok() || sec < 0 || sec > 59 || r.used > 2)
                return INT_MIN;
            begin += r.used;
        }
    }

    // we must have consumed everything
    if (begin != end)
        return INT_MIN;

    return (hour * 60 + min) * 60 + sec;
}